

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x03'>::basic_dynamic_counter
          (basic_dynamic_counter<long,_(unsigned_char)__x03_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  local_88;
  
  std::__cxx11::string::string(&local_a8,name);
  std::__cxx11::string::string(&bStack_c8,help);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  array(&local_88,labels_name);
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)3>::metric_t<3ul>
            ((dynamic_metric_impl<std::atomic<long>,(unsigned_char)3> *)this,Counter,&local_a8,
             &bStack_c8,&local_88);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  ~array(&local_88);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_>).super_dynamic_metric.
  super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_001e9418;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}